

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

void anon_unknown.dwarf_1bd17c::CleanupFunction(string *namespaceName)

{
  bool bVar1;
  char *in_RDI;
  
  bVar1 = std::operator==(namespaceName,in_RDI);
  if (((bVar1) || (bVar1 = std::operator==(namespaceName,in_RDI), bVar1)) ||
     (bVar1 = std::operator==(namespaceName,in_RDI), bVar1)) {
    simd::EnableSimd(false);
  }
  return;
}

Assistant:

void CleanupFunction(const std::string& namespaceName)
    {
        if ( (namespaceName == "image_function_avx") || (namespaceName == "image_function_sse") || (namespaceName == "image_function_neon") )
            simd::EnableSimd( true );
    }